

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O0

shared_ptr<gui::Label> __thiscall gui::Slider::getLabel(Slider *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::Label> *in_RSI;
  element_type *in_RDI;
  shared_ptr<gui::Label> sVar1;
  
  std::shared_ptr<gui::Label>::shared_ptr(in_RSI,(shared_ptr<gui::Label> *)in_RDI);
  sVar1.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<gui::Label>)sVar1.super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Label> Slider::getLabel() const {
    return label_;
}